

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int arena_i_decay_ms_ctl_impl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen,_Bool dirty)

{
  ulong uVar1;
  _Bool _Var2;
  int iVar3;
  size_t __n;
  arena_t *arena;
  ssize_t local_38;
  
  iVar3 = 0xe;
  if (mib[1] >> 0x20 == 0) {
    arena = (arena_t *)duckdb_je_arenas[mib[1]].repr;
    if (arena == (arena_t *)0x0) {
      arena = (arena_t *)0x0;
    }
    if (arena != (arena_t *)0x0) {
      if (oldp != (void *)0x0 && miblen != 0) {
        local_38 = duckdb_je_arena_decay_ms_get(arena,extent_state_muzzy - (byte)newlen);
        uVar1 = *oldp;
        if (uVar1 == 8) {
          *(ssize_t *)miblen = local_38;
        }
        else {
          __n = 8;
          if (uVar1 < 8) {
            __n = uVar1;
          }
          switchD_012e1ce8::default((void *)miblen,&local_38,__n);
          *(size_t *)oldp = __n;
        }
        if (uVar1 != 8) {
          return 0x16;
        }
      }
      if (oldlenp != (size_t *)0x0) {
        if (newp != (void *)0x8) {
          return 0x16;
        }
        _Var2 = duckdb_je_arena_decay_ms_set
                          ((tsdn_t *)tsd,arena,extent_state_muzzy - (byte)newlen,*oldlenp);
        if (_Var2) {
          return 0xe;
        }
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int
arena_i_decay_ms_ctl_impl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen, bool dirty) {
	int ret;
	unsigned arena_ind;
	arena_t *arena;

	MIB_UNSIGNED(arena_ind, 1);
	arena = arena_get(tsd_tsdn(tsd), arena_ind, false);
	if (arena == NULL) {
		ret = EFAULT;
		goto label_return;
	}
	extent_state_t state = dirty ? extent_state_dirty : extent_state_muzzy;

	if (oldp != NULL && oldlenp != NULL) {
		size_t oldval = arena_decay_ms_get(arena, state);
		READ(oldval, ssize_t);
	}
	if (newp != NULL) {
		if (newlen != sizeof(ssize_t)) {
			ret = EINVAL;
			goto label_return;
		}

		if (arena_decay_ms_set(tsd_tsdn(tsd), arena, state,
		    *(ssize_t *)newp)) {
			ret = EFAULT;
			goto label_return;
		}
	}

	ret = 0;
label_return:
	return ret;
}